

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O3

void Omega_h::transfer_common<long>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,LOs *prods2new_ents,TagBase *tagbase,
               Read<signed_char> *prod_data)

{
  int *piVar1;
  Alloc *pAVar2;
  LO LVar3;
  Int width;
  Write<signed_char> new_data;
  Write<long> local_d0;
  LOs local_c0;
  LOs local_b0;
  LOs local_a0;
  Read<signed_char> local_90;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Mesh *local_60;
  Mesh *local_58;
  string local_50;
  
  local_60 = old_mesh;
  local_58 = new_mesh;
  LVar3 = Mesh::nents(new_mesh,ent_dim);
  width = TagBase::ncomps(tagbase);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Write<long>::Write(&local_d0,LVar3 * width,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_90.write_.shared_alloc_.alloc = (prod_data->write_).shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = (prod_data->write_).shared_alloc_.direct_ptr;
  local_a0.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a0.write_.shared_alloc_.alloc)->use_count =
           (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = (prods2new_ents->write_).shared_alloc_.direct_ptr;
  local_70.shared_alloc_.alloc = local_d0.shared_alloc_.alloc;
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_70.shared_alloc_.alloc = (Alloc *)((local_d0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d0.shared_alloc_.alloc)->use_count = (local_d0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.shared_alloc_.direct_ptr = local_d0.shared_alloc_.direct_ptr;
  map_into<long>(&local_90,&local_a0,&local_70,width);
  pAVar2 = local_70.shared_alloc_.alloc;
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_70.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_b0.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc =
           (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b0.write_.shared_alloc_.alloc)->use_count =
           (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_c0.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc =
           (Alloc *)((local_c0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c0.write_.shared_alloc_.alloc)->use_count =
           (local_c0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.write_.shared_alloc_.direct_ptr = (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
  local_80.shared_alloc_.alloc = local_d0.shared_alloc_.alloc;
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_80.shared_alloc_.alloc = (Alloc *)((local_d0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d0.shared_alloc_.alloc)->use_count = (local_d0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.shared_alloc_.direct_ptr = local_d0.shared_alloc_.direct_ptr;
  transfer_common2<long>(local_60,local_58,ent_dim,&local_b0,&local_c0,tagbase,&local_80);
  pAVar2 = local_80.shared_alloc_.alloc;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_80.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_c0.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_d0.shared_alloc_.alloc & 7) == 0 && local_d0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_d0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.shared_alloc_.alloc);
      operator_delete(local_d0.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void transfer_common(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, LOs prods2new_ents,
    TagBase const* tagbase, Read<T> prod_data) {
  auto nnew_ents = new_mesh->nents(ent_dim);
  auto ncomps = tagbase->ncomps();
  auto new_data = Write<T>(nnew_ents * ncomps);
  map_into(prod_data, prods2new_ents, new_data, ncomps);
  transfer_common2(old_mesh, new_mesh, ent_dim, same_ents2old_ents,
      same_ents2new_ents, tagbase, new_data);
}